

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

pair<QMultiHash<int,_QString>::const_iterator,_QMultiHash<int,_QString>::const_iterator> *
__thiscall QMultiHash<int,_QString>::equal_range_impl<int>(QMultiHash<int,_QString> *this,int *key)

{
  piter it_00;
  piter it_01;
  bool bVar1;
  long *in_RSI;
  pair<QMultiHash<int,_QString>::const_iterator,_QMultiHash<int,_QString>::const_iterator> *in_RDI;
  long in_FS_OFFSET;
  iterator end;
  iterator it;
  Bucket bucket;
  Data<QHashPrivate::MultiNode<int,_QString>_> *in_stack_fffffffffffffe98;
  QMultiHash<int,_QString> *in_stack_fffffffffffffea0;
  const_iterator *pcVar2;
  const_iterator *in_stack_fffffffffffffea8;
  const_iterator *pcVar3;
  Data<QHashPrivate::MultiNode<int,_QString>_> *in_stack_fffffffffffffeb0;
  size_t in_stack_fffffffffffffeb8;
  const_iterator local_e0;
  Data<QHashPrivate::MultiNode<int,_QString>_> *local_c8;
  size_t sStack_c0;
  const_iterator local_b0;
  Data<QHashPrivate::MultiNode<int,_QString>_> *local_98;
  size_t sStack_90;
  iterator local_88;
  const_iterator local_78;
  const_iterator local_60;
  Bucket local_48;
  const_iterator local_38;
  const_iterator local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RSI == 0) {
    QMultiHash<int,_QString>::end(in_stack_fffffffffffffea0);
    QMultiHash<int,_QString>::end(in_stack_fffffffffffffea0);
    std::pair<QMultiHash<int,_QString>::const_iterator,_QMultiHash<int,_QString>::const_iterator>::
    pair<QMultiHash<int,_QString>::const_iterator,_QMultiHash<int,_QString>::const_iterator,_true>
              (in_RDI,&local_20,&local_38);
  }
  else {
    local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = QHashPrivate::Data<QHashPrivate::MultiNode<int,_QString>_>::findBucket<int>
                         (in_stack_fffffffffffffeb0,(int *)in_stack_fffffffffffffea8);
    bVar1 = QHashPrivate::Data<QHashPrivate::MultiNode<int,_QString>_>::Bucket::isUnused
                      ((Bucket *)0x78a626);
    if (bVar1) {
      pcVar2 = &local_60;
      QMultiHash<int,_QString>::end(in_stack_fffffffffffffea0);
      pcVar3 = &local_78;
      QMultiHash<int,_QString>::end(in_stack_fffffffffffffea0);
      std::pair<QMultiHash<int,_QString>::const_iterator,_QMultiHash<int,_QString>::const_iterator>
      ::
      pair<QMultiHash<int,_QString>::const_iterator,_QMultiHash<int,_QString>::const_iterator,_true>
                (in_RDI,pcVar2,pcVar3);
    }
    else {
      local_88.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d = (Data<QHashPrivate::MultiNode<int,_QString>_> *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = QHashPrivate::Data<QHashPrivate::MultiNode<int,_QString>_>::Bucket::toIterator
                           ((Bucket *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      local_98 = local_88.d;
      sStack_90 = local_88.bucket;
      QHashPrivate::iterator<QHashPrivate::MultiNode<int,_QString>_>::operator++
                (&in_stack_fffffffffffffea8->i);
      local_c8 = local_88.d;
      sStack_c0 = local_88.bucket;
      pcVar2 = &local_b0;
      it_00.bucket = in_stack_fffffffffffffeb8;
      it_00.d = in_stack_fffffffffffffeb0;
      const_iterator::const_iterator(in_stack_fffffffffffffea8,it_00,(Chain **)pcVar2);
      pcVar3 = &local_e0;
      it_01.bucket = in_stack_fffffffffffffeb8;
      it_01.d = in_stack_fffffffffffffeb0;
      const_iterator::const_iterator(pcVar3,it_01,(Chain **)pcVar2);
      std::pair<QMultiHash<int,_QString>::const_iterator,_QMultiHash<int,_QString>::const_iterator>
      ::
      pair<QMultiHash<int,_QString>::const_iterator,_QMultiHash<int,_QString>::const_iterator,_true>
                (in_RDI,pcVar2,pcVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<const_iterator, const_iterator> equal_range_impl(const K &key) const noexcept
    {
        if (!d)
            return {end(), end()};

        auto bucket = d->findBucket(key);
        if (bucket.isUnused())
            return {end(), end()};
        auto it = bucket.toIterator(d);
        auto end = it;
        ++end;
        return {const_iterator(it), const_iterator(end)};
    }